

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O2

bool Omega_h::should_transfer_no_products(Mesh *mesh,TransferOpts *opts,Int dim,TagBase *tag)

{
  bool bVar1;
  Mesh *pMVar2;
  
  pMVar2 = mesh;
  bVar1 = should_inherit(mesh,opts,dim,tag);
  if (!bVar1) {
    bVar1 = should_interpolate(pMVar2,opts,dim,tag);
    if (!bVar1) {
      bVar1 = is_metric(mesh,opts,dim,tag);
      if (!bVar1) {
        bVar1 = should_conserve(mesh,opts,dim,tag);
        if (!bVar1) {
          bVar1 = is_density(mesh,opts,dim,tag);
          if (!bVar1) {
            bVar1 = is_momentum_velocity(mesh,opts,dim,tag);
            return bVar1;
          }
        }
      }
    }
  }
  return true;
}

Assistant:

static bool should_transfer_no_products(
    Mesh* mesh, TransferOpts const& opts, Int dim, TagBase const* tag) {
  return should_inherit(mesh, opts, dim, tag) ||
         should_interpolate(mesh, opts, dim, tag) ||
         is_metric(mesh, opts, dim, tag) ||
         should_conserve(mesh, opts, dim, tag) ||
         is_density(mesh, opts, dim, tag) ||
         is_momentum_velocity(mesh, opts, dim, tag);
}